

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall nonius::html_reporter::do_suite_complete(html_reporter *this)

{
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *pfVar1;
  void *pvVar2;
  pointer pdVar3;
  html_reporter *phVar4;
  int iVar5;
  string *psVar6;
  mapped_type *pmVar7;
  DataList *pDVar8;
  _Hash_node_base *p_Var9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  basic_ostream<char,_std::char_traits<char>_> *stream;
  pointer prVar10;
  pointer pdVar11;
  pointer pcVar12;
  double dVar13;
  data_map item_1;
  data_map item;
  data_map run_item;
  data_list params;
  data_map map;
  string local_270;
  double local_250;
  undefined1 local_248 [32];
  float local_228;
  size_t local_220;
  __node_base_ptr ap_Stack_218 [2];
  key_type local_208;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  float local_1c0;
  undefined4 uStack_1bc;
  pointer local_1b8;
  __node_base_ptr p_Stack_1b0;
  pointer local_1a8;
  pointer local_198;
  duration<double,_std::ratio<1L,_1L>_> local_190;
  duration<double,_std::ratio<1L,_1L>_> local_170;
  data_ptr local_130;
  undefined1 local_118 [32];
  float local_f8;
  size_t local_f0;
  __node_base_ptr p_Stack_e8;
  pointer local_e0;
  vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> local_d8;
  html_reporter *local_b8;
  string *local_b0;
  pointer local_a8;
  _Hash_node_base *local_a0;
  double local_98;
  double local_90;
  string local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\ngenerating HTML report\n",0x18);
  }
  psVar6 = template_string_abi_cxx11_();
  local_250 = ideal_magnitude(this);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  escape((string *)local_1e0,&this->title);
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"title","");
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_68,(key_type *)local_118);
  cpptempl::data_ptr::operator=(pmVar7,(string *)local_1e0);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  if (local_250 <= 1.0) {
    local_1d0._M_allocated_capacity._0_2_ = 0x73;
    local_1e0._8_8_ = 1;
  }
  else {
    if (local_250 <= 1000.0) {
      local_1d0._M_allocated_capacity._0_2_ = 0x736d;
    }
    else {
      if (local_250 <= 1000000.0) {
        local_1e0._8_8_ = 3;
        local_1d0._M_allocated_capacity._0_4_ = 0x73bcce;
        goto LAB_00143cd5;
      }
      local_1d0._M_allocated_capacity._0_2_ = 0x736e;
    }
    local_1e0._8_8_ = 2;
    local_1d0._M_local_buf[2] = 0;
  }
LAB_00143cd5:
  local_1e0._0_8_ = local_1e0 + 0x10;
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"units","");
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_68,(key_type *)local_118);
  cpptempl::data_ptr::operator=(pmVar7,(string *)local_1e0);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  local_1e0._0_8_ = local_1e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"logarithmic","");
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_68,(key_type *)local_1e0);
  cpptempl::data_ptr::operator=(pmVar7,&this->logarithmic);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  local_1e0._0_8_ = local_1e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"runparam","");
  local_b0 = psVar6;
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_68,(key_type *)local_1e0);
  cpptempl::data_ptr::operator=(pmVar7,&this->run_param);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  prVar10 = (this->runs).
            super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (this->runs).
             super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = this;
  if (prVar10 != local_a8) {
    local_250 = local_250 * 1000.0;
    do {
      pcVar12 = local_248 + 0x10;
      local_118._0_8_ = &p_Stack_e8;
      local_118._8_8_ = 1;
      local_118._16_8_ = 0;
      local_118._24_8_ = 0;
      local_f8 = 1.0;
      local_f0 = 0;
      p_Stack_e8 = (__node_base_ptr)0x0;
      local_d8.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e0 = prVar10;
      for (p_Var9 = (prVar10->params).
                    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
                    ._M_h._M_before_begin._M_nxt; p_Var9 != (_Hash_node_base *)0x0;
          p_Var9 = p_Var9->_M_nxt) {
        local_1e0._0_8_ = &p_Stack_1b0;
        local_1e0._8_8_ = 1;
        local_1d0._M_allocated_capacity = 0;
        local_1d0._8_8_ = 0;
        local_1c0 = 1.0;
        local_1b8 = (pointer)0x0;
        p_Stack_1b0 = (__node_base_ptr)0x0;
        local_248._0_8_ = pcVar12;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"name","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_1e0,(key_type *)local_248);
        cpptempl::data_ptr::operator=(pmVar7,(string *)(p_Var9 + 1));
        if ((pointer)local_248._0_8_ != pcVar12) {
          operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
        }
        local_248._0_8_ = pcVar12;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"value","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_1e0,(key_type *)local_248);
        cpptempl::data_ptr::operator=(pmVar7,(param *)(p_Var9 + 5));
        if ((pointer)local_248._0_8_ != pcVar12) {
          operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
        }
        cpptempl::data_ptr::data_ptr<cpptempl::data_map>
                  ((data_ptr *)local_248,(data_map *)local_1e0);
        std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::
        emplace_back<cpptempl::data_ptr>(&local_d8,(data_ptr *)local_248);
        local_248._0_8_ = &PTR__data_ptr_0020bdb8;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1e0);
      }
      pDVar8 = (DataList *)operator_new(0x20);
      prVar10 = local_e0;
      (pDVar8->super_Data)._vptr_Data = (_func_int **)&PTR_empty_0020b780;
      std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::vector
                (&pDVar8->m_items,&local_d8);
      local_248._0_8_ = &PTR__data_ptr_0020bdb8;
      local_248._8_8_ = pDVar8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::DataList*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_248 + 0x10),pDVar8);
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"params","");
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_118,(key_type *)local_1e0);
      (pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_248._8_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_248 + 0x10));
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
      }
      local_248._0_8_ = &PTR__data_ptr_0020bdb8;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_);
      }
      p_Var9 = (prVar10->data)._M_h._M_before_begin._M_nxt;
      while (p_Var9 != (_Hash_node_base *)0x0) {
        local_a0 = p_Var9;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
                *)local_1e0,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
                *)(p_Var9 + 1));
        local_248._0_8_ = ap_Stack_218;
        local_248._8_8_ = (DataList *)0x1;
        local_248._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_248._24_8_ = 0;
        local_228 = 1.0;
        local_220 = 0;
        ap_Stack_218[0] = (__node_base_ptr)0x0;
        escape(&local_270,(string *)local_1e0);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"name","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_248,&local_208);
        cpptempl::data_ptr::operator=(pmVar7,&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          (ulong)(local_270.field_2._M_allocated_capacity + 1));
        }
        dVar13 = trunc(local_190.__r * local_250);
        local_208._M_dataplus._M_p = (pointer)(dVar13 * 0.001);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"mean","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_248,&local_270);
        cpptempl::data_ptr::operator=(pmVar7,(double *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          (ulong)(local_270.field_2._M_allocated_capacity + 1));
        }
        dVar13 = trunc(local_170.__r * local_250);
        local_208._M_dataplus._M_p = (pointer)(dVar13 * 0.001);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"stddev","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_248,&local_270);
        cpptempl::data_ptr::operator=(pmVar7,(double *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          (ulong)(local_270.field_2._M_allocated_capacity + 1));
        }
        pdVar3 = local_1b8;
        for (pdVar11 = (pointer)CONCAT44(uStack_1bc,local_1c0); pdVar11 != pdVar3;
            pdVar11 = pdVar11 + 1) {
          local_98 = pdVar11->__r;
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"samples","");
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_248,&local_270);
          local_90 = trunc(local_98 * local_250);
          local_90 = local_90 * 0.001;
          cpptempl::data_ptr::data_ptr<double>(&local_130,&local_90);
          if ((pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            pDVar8 = (DataList *)operator_new(0x20);
            local_208._M_dataplus._M_p = (pointer)0x0;
            local_208._M_string_length = 0;
            local_208.field_2._M_allocated_capacity = 0;
            (pDVar8->super_Data)._vptr_Data = (_func_int **)&PTR_empty_0020b780;
            std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::vector
                      (&pDVar8->m_items,
                       (vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)&local_208
                      );
            std::__shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>::reset<cpptempl::DataList>
                      (&(pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>
                       ,pDVar8);
            std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::~vector
                      ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)&local_208
                      );
          }
          iVar5 = (*((pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_vptr_Data[2])();
          std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::push_back
                    ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)
                     CONCAT44(extraout_var,iVar5),&local_130);
          local_130._vptr_data_ptr = (_func_int **)&PTR__data_ptr_0020bdb8;
          if (local_130.ptr.super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_130.ptr.super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,
                            (ulong)(local_270.field_2._M_allocated_capacity + 1));
          }
        }
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"benchmarks","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_118,&local_270);
        cpptempl::data_ptr::data_ptr<cpptempl::data_map>(&local_130,(data_map *)local_248);
        prVar10 = local_e0;
        if ((pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          pDVar8 = (DataList *)operator_new(0x20);
          local_208._M_dataplus._M_p = (pointer)0x0;
          local_208._M_string_length = 0;
          local_208.field_2._M_allocated_capacity = 0;
          (pDVar8->super_Data)._vptr_Data = (_func_int **)&PTR_empty_0020b780;
          std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::vector
                    (&pDVar8->m_items,
                     (vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)&local_208);
          std::__shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>::reset<cpptempl::DataList>
                    (&(pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>,
                     pDVar8);
          std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::~vector
                    ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)&local_208);
        }
        iVar5 = (*((pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_vptr_Data[2])();
        std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::push_back
                  ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)
                   CONCAT44(extraout_var_00,iVar5),&local_130);
        local_130._vptr_data_ptr = (_func_int **)&PTR__data_ptr_0020bdb8;
        if (local_130.ptr.super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_130.ptr.super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          (ulong)(local_270.field_2._M_allocated_capacity + 1));
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_248);
        if (local_1a8 != (pointer)0x0) {
          operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
        }
        pvVar2 = (void *)CONCAT44(uStack_1bc,local_1c0);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,(long)p_Stack_1b0 - (long)pvVar2);
        }
        if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
          operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
        }
        p_Var9 = local_a0->_M_nxt;
      }
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"runs","");
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_68,(key_type *)local_1e0);
      cpptempl::data_ptr::data_ptr<cpptempl::data_map>((data_ptr *)&local_270,(data_map *)local_118)
      ;
      if ((pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        pDVar8 = (DataList *)operator_new(0x20);
        local_248._0_8_ = (__node_base_ptr *)0x0;
        local_248._8_8_ = (DataList *)0x0;
        local_248._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (pDVar8->super_Data)._vptr_Data = (_func_int **)&PTR_empty_0020b780;
        std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::vector
                  (&pDVar8->m_items,
                   (vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)local_248);
        std::__shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>::reset<cpptempl::DataList>
                  (&(pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>,
                   pDVar8);
        std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::~vector
                  ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)local_248);
      }
      iVar5 = (*((pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->_vptr_Data[2])();
      std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::push_back
                ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)
                 CONCAT44(extraout_var_01,iVar5),(value_type *)&local_270);
      local_270._M_dataplus._M_p = (pointer)&PTR__data_ptr_0020bdb8;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270.field_2._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_270.field_2._M_allocated_capacity);
      }
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
      }
      std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::~vector(&local_d8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_118);
      prVar10 = prVar10 + 1;
    } while (prVar10 != local_a8);
  }
  phVar4 = local_b8;
  if ((local_b8->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &(local_b8->super_reporter).os;
    stream = (*(local_b8->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
    pcVar12 = (local_b0->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar12,pcVar12 + local_b0->_M_string_length);
    cpptempl::parse(stream,&local_88,(data_map *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((phVar4->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(phVar4->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
      std::ostream::flush();
      if (phVar4->verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done\n",5);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      return;
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

void do_suite_complete() override {
            if(verbose) progress_stream() << "\ngenerating HTML report\n";

            auto&& templ = template_string();
            auto magnitude = ideal_magnitude();

            cpptempl::data_map map;
            map["title"] = escape(title);
            map["units"] = detail::units_for_magnitude(magnitude);
            map["logarithmic"] = logarithmic;
            map["runparam"] = run_param;
            for (auto&& r : runs) {
                cpptempl::data_map run_item;
                cpptempl::data_list params;
                for (auto&& p : r.params) {
                    cpptempl::data_map item;
                    item["name"] = p.first;
                    item["value"] = p.second;
                    params.push_back(item);
                }
                run_item["params"] = cpptempl::make_data(params);
                for(auto d : r.data) {
                    cpptempl::data_map item;
                    item["name"] = escape(d.first);
                    item["mean"] = truncate(d.second.analysis.mean.point.count() * magnitude);
                    item["stddev"] = truncate(d.second.analysis.standard_deviation.point.count() * magnitude);
                    for(auto e : d.second.samples)
                        item["samples"].push_back(truncate(e.count() * magnitude));
                    run_item["benchmarks"].push_back(item);
                }
                map["runs"].push_back(run_item);
            }

            cpptempl::parse(report_stream(), templ, map);
            report_stream() << std::flush;
            if(verbose) progress_stream() << "done\n";
        }